

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O0

void __thiscall
duckdb::roaring::ContainerCompressionState::ContainerCompressionState
          (ContainerCompressionState *this)

{
  undefined2 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  *(undefined1 *)(in_RDI + 4) = 0;
  *(undefined8 *)(in_RDI + 0x1c8) = 0;
  *(undefined1 *)(in_RDI + 0x1cc) = 0;
  Reset(this);
  return;
}

Assistant:

ContainerCompressionState::ContainerCompressionState() {
	Reset();
}